

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead.cc
# Opt level: O2

void __thiscall
pstack::Procman::CoreProcess::CoreProcess(CoreProcess *this,Context *ctx,sptr *exec,sptr *core)

{
  _Rb_tree_header *p_Var1;
  pointer pNVar2;
  pointer pNVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  mapped_type *pmVar7;
  undefined1 auStack_278 [8];
  elf_prstatus task;
  iterator __end2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  undefined1 local_e8 [8];
  iterator __begin2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  undefined1 local_a8 [8];
  NoteDesc note;
  Reader *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  elf_prpsinfo *local_70;
  sptr local_68;
  sptr local_58;
  vector<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_> *local_48;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  *local_40;
  CoreProcess *local_38;
  
  (this->super_Process)._vptr_Process = (_func_int **)&PTR_findRDebugAddr_00150e50;
  local_68.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (exec->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_68.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (exec->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  (exec->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (exec->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_e8 = (undefined1  [8])this;
  std::
  make_shared<pstack::Procman::CoreReader,pstack::Procman::CoreProcess*,std::shared_ptr<pstack::Elf::Object>&>
            ((CoreProcess **)auStack_278,(shared_ptr<pstack::Elf::Object> *)local_e8);
  local_58.super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auStack_278;
  local_58.super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)task.pr_info._0_8_;
  auStack_278 = (undefined1  [8])0x0;
  task.pr_info.si_signo = 0;
  task.pr_info.si_code = 0;
  Process::Process(&this->super_Process,ctx,&local_68,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&task);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (this->super_Process)._vptr_Process = (_func_int **)&PTR_findRDebugAddr_00150e50;
  local_48 = &this->notes;
  (this->notes).super__Vector_base<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->notes).super__Vector_base<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->notes).super__Vector_base<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lwpToPrStatusIdx)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_40 = &this->lwpToPrStatusIdx;
  (this->lwpToPrStatusIdx)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->lwpToPrStatusIdx)._M_t._M_impl.super__Rb_tree_header;
  (this->lwpToPrStatusIdx)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->lwpToPrStatusIdx)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  memset(&(this->lwpToPrStatusIdx)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0x90);
  (this->coreImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = (core->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var5 = (core->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (core->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->coreImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar4;
  (this->coreImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var5;
  (core->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  note.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (this->coreImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pstack::Elf::Notes::begin();
  pstack::Elf::Notes::end();
  local_70 = &this->prpsinfo;
  local_38 = this;
  while( true ) {
    bVar6 = Elf::Notes::iterator::operator!=((iterator *)local_e8,(iterator *)&task.pr_fpvalid);
    if (!bVar6) break;
    Elf::Notes::iterator::operator*((NoteDesc *)local_a8,(iterator *)local_e8);
    pstack::Elf::NoteDesc::name_abi_cxx11_();
    bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            auStack_278,"CORE");
    std::__cxx11::string::~string((string *)auStack_278);
    if (bVar6) {
      if (note.note.n_namesz == 1) {
        pstack::Elf::NoteDesc::data();
        Reader::readObj<elf_prstatus>((elf_prstatus *)auStack_278,local_80,0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
        pNVar2 = (local_38->notes).
                 super__Vector_base<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pNVar3 = (local_38->notes).
                 super__Vector_base<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pmVar7 = std::
                 map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                 ::operator[](local_40,(key_type *)&task.pr_sighold);
        *pmVar7 = (long)pNVar3 - (long)pNVar2 >> 5;
      }
      else if (note.note.n_namesz == 3) {
        pstack::Elf::NoteDesc::data();
        Reader::readObj<elf_prpsinfo>((Reader *)auStack_278,0,local_70,1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&task);
      }
    }
    std::vector<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>::push_back
              (local_48,(NoteDesc *)local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&note.io);
    pstack::Elf::Notes::iterator::operator++((iterator *)local_e8);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
  return;
}

Assistant:

CoreProcess::CoreProcess(Context &ctx, Elf::Object::sptr exec, Elf::Object::sptr core)
   : Process(ctx, std::move(exec), std::make_shared<CoreReader>(this, core))
     , prpsinfo{}
     , coreImage(std::move(core))
{
   for (auto note : coreImage->notes()) {
      if (note.name() == "CORE") {
         switch  (note.type() ) {
            case NT_PRSTATUS: {
               // for NT_PRSTATUS notes, mark the index of the current note in our
               // vector as the start of the notes for that LWP. When looking
               // for an LWP-related note, we start at the index for that LWPs
               // NT_PRSTATUS, and consider it a failure if we reach another
               // NT_PRSTATUS or the end of the list.
               auto task = note.data()->readObj<prstatus_t>(0);
               lwpToPrStatusIdx[task.pr_pid] = notes.size();
               break;
            }
            case NT_PRPSINFO: {
               note.data()->readObj(0, &prpsinfo); // hold on to a copy of this
               break;
            }
            default:
               break;
         }
      }
      notes.push_back( note );
   }
}